

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O3

void __thiscall helics::udp::UdpServer::~UdpServer(UdpServer *this)

{
  _Atomic_word *p_Var1;
  _Manager_type p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  error_code ec;
  
  ::asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::cancel
            (&(this->mSocket).super_basic_socket<asio::ip::udp,_asio::any_io_executor>);
  std::_V2::system_category();
  ::asio::detail::reactive_socket_service_base::close
            ((reactive_socket_service_base *)
             &((this->mSocket).super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
              service_)->super_reactive_socket_service_base,(int)this + 0x18);
  p_Var2 = (this->mDataCall).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->mDataCall,(_Any_data *)&this->mDataCall,__destroy_functor);
  }
  ::asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>::
  ~io_object_impl((io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
                   *)&this->mSocket);
  p_Var3 = (this->super_enable_shared_from_this<helics::udp::UdpServer>)._M_weak_this.
           super___weak_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

~UdpServer()
        {
            try {
                stop_receive();
            }
            catch (...) {
            }
            try {
                asio::error_code ec;
                mSocket.close(ec);
            }
            catch (...) {
            }
        }